

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttsbit.c
# Opt level: O1

FT_Error tt_sbit_decoder_load_image
                   (TT_SBitDecoder decoder,FT_UInt glyph_index,FT_Int x_pos,FT_Int y_pos,
                   FT_UInt recurse_count,FT_Bool metrics_only)

{
  uint *puVar1;
  ushort uVar2;
  ushort *limit;
  uint uVar3;
  uint uVar4;
  FT_Error FVar5;
  ushort *puVar7;
  ulong uVar8;
  ulong uVar9;
  ushort uVar10;
  int iVar11;
  FT_ULong FVar12;
  long lVar13;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  bool bVar17;
  ushort *local_68;
  FT_Int local_5c;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  ushort *puVar6;
  
  puVar7 = (ushort *)(decoder->eblc_base + decoder->strike_index_array);
  if (100 < recurse_count) {
    return 8;
  }
  FVar12 = decoder->strike_index_count;
  if (FVar12 != 0) {
    limit = (ushort *)decoder->eblc_limit;
    puVar6 = puVar7;
LAB_0024d8c5:
    uVar4 = (uint)(ushort)(*puVar6 << 8 | *puVar6 >> 8);
    uVar15 = glyph_index - uVar4;
    if ((glyph_index < uVar4) || ((ushort)(puVar6[1] << 8 | puVar6[1] >> 8) < glyph_index))
    goto LAB_0024d8ee;
    uVar4 = *(uint *)(puVar6 + 2);
    uVar8 = (ulong)(uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18)
    ;
    if ((ulong)((long)limit - (long)puVar7) < uVar8) {
      return 8;
    }
    puVar6 = (ushort *)((long)puVar7 + uVar8);
    puVar7 = (ushort *)((long)puVar7 + uVar8 + 8);
    if (limit < puVar7) goto LAB_0024d8ff;
    uVar10 = *puVar6 << 8 | *puVar6 >> 8;
    uVar2 = puVar6[1];
    uVar4 = *(uint *)(puVar6 + 2);
    uVar8 = (ulong)uVar4;
    switch(uVar10) {
    case 1:
      puVar1 = (uint *)((long)puVar7 + (ulong)(uVar15 * 4));
      local_68 = (ushort *)((long)puVar7 + (ulong)(uVar15 * 4) + 8);
      if (limit < local_68) goto LAB_0024d8ff;
      uVar15 = *puVar1;
      uVar16 = (ulong)(uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                      uVar15 << 0x18);
      uVar15 = puVar1[1];
      uVar9 = (ulong)(uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                     uVar15 << 0x18);
      break;
    case 2:
      iVar11 = 9;
      if (limit < puVar6 + 10) {
        uVar9 = 0;
        uVar16 = 0;
        local_68 = puVar7;
      }
      else {
        local_68 = puVar6 + 6;
        local_50 = (ulong)(byte)puVar6[4];
        local_48 = (ulong)*(byte *)((long)puVar6 + 9);
        local_38 = (ulong)(byte)puVar6[5];
        local_40 = (ulong)*(byte *)((long)puVar6 + 0xb);
        local_5c = y_pos;
        local_58 = uVar8;
        uVar4 = tt_sbit_decoder_load_metrics(decoder,(FT_Byte **)&local_68,(FT_Byte *)limit,'\x01');
        uVar9 = 0;
        if (uVar4 == 0) {
          uVar4 = (int)local_48 << 0x10 | (int)local_50 << 0x18;
          lVar14 = ((int)local_38 << 8 | uVar4) + local_40;
          uVar16 = (ulong)uVar15 * lVar14;
          uVar9 = lVar14 + uVar16;
          iVar11 = 0;
        }
        else {
          uVar16 = 0;
          iVar11 = 9;
        }
        puVar6 = (ushort *)(ulong)uVar4;
        uVar4 = (uint)local_58;
        y_pos = local_5c;
      }
      FVar5 = (FT_Error)puVar6;
      goto joined_r0x0024da11;
    case 3:
      puVar6 = (ushort *)((long)puVar7 + (ulong)(uVar15 * 2));
      local_68 = (ushort *)((long)puVar7 + (ulong)(uVar15 * 2) + 4);
      if (limit < local_68) goto LAB_0024d8ff;
      uVar10 = *puVar6;
      uVar16 = (ulong)(ushort)(uVar10 << 8 | uVar10 >> 8);
      uVar10 = puVar6[1];
      uVar9 = (ulong)(ushort)(uVar10 << 8 | uVar10 >> 8);
      break;
    case 4:
      local_68 = puVar6 + 6;
      iVar11 = 9;
      if ((limit < local_68) || (puVar7 = local_68, limit < puVar6 + 8)) {
        local_68 = puVar7;
        uVar9 = 0;
        uVar16 = 0;
        goto LAB_0024da0f;
      }
      lVar14 = (ulong)(byte)puVar6[4] * 0x1000000;
      lVar13 = (ulong)*(byte *)((long)puVar6 + 9) * 0x10000;
      uVar9 = (ulong)(byte)puVar6[5] * 0x100;
      uVar16 = lVar13 + lVar14 | uVar9 | (ulong)*(byte *)((long)puVar6 + 0xb);
      if (((long)limit - (long)local_68 >> 2) - 1U < uVar16) {
        uVar9 = 0;
        uVar16 = 0;
        local_58 = uVar8;
        goto LAB_0024da0f;
      }
      if (uVar16 != 0) {
        lVar14 = uVar9 + *(byte *)((long)puVar6 + 0xb) + lVar14 + lVar13;
        uVar16 = 0;
        uVar9 = 0;
        goto LAB_0024dcef;
      }
      uVar9 = 0;
      uVar16 = 0;
      puVar6 = local_68;
      local_58 = uVar8;
      goto LAB_0024da0f;
    case 5:
      goto switchD_0024d98c_caseD_5;
    default:
      if (uVar10 == 0x13) {
switchD_0024d98c_caseD_5:
        if (limit < puVar6 + 0xc) goto LAB_0024d9e0;
        local_68 = puVar6 + 6;
        uVar15 = *(uint *)(puVar6 + 4);
        local_5c = y_pos;
        local_58 = uVar8;
        uVar3 = tt_sbit_decoder_load_metrics(decoder,(FT_Byte **)&local_68,(FT_Byte *)limit,'\x01');
        uVar4 = (uint)local_58;
        puVar7 = (ushort *)(ulong)uVar3;
        puVar6 = local_68;
        y_pos = local_5c;
        if (uVar3 == 0) {
          puVar6 = local_68 + 2;
          lVar14 = (ulong)(byte)*local_68 * 0x1000000;
          lVar13 = (ulong)*(byte *)((long)local_68 + 1) * 0x10000;
          uVar9 = (ulong)(byte)local_68[1] * 0x100;
          uVar8 = lVar13 + lVar14 | uVar9 | (ulong)*(byte *)((long)local_68 + 3);
          puVar7 = local_68;
          if (uVar8 <= (ulong)((long)limit - (long)puVar6 >> 1)) {
            bVar17 = uVar8 != 0;
            puVar7 = puVar6;
            if (uVar8 == 0) goto LAB_0024d9e0;
            uVar10 = *puVar6;
            puVar6 = local_68 + 3;
            if ((ushort)(uVar10 << 8 | uVar10 >> 8) == glyph_index) {
              uVar16 = 0;
              goto LAB_0024dd69;
            }
            uVar16 = 0;
            goto LAB_0024dd48;
          }
        }
        local_68 = puVar6;
        puVar6 = puVar7;
        uVar9 = 0;
        uVar16 = 0;
        iVar11 = 9;
        goto LAB_0024dabd;
      }
      goto LAB_0024d8ff;
    }
    if (uVar16 != uVar9) goto LAB_0024dc8b;
  }
  goto LAB_0024d8ff;
LAB_0024d8ee:
  FVar12 = FVar12 - 1;
  puVar6 = puVar6 + 4;
  if (FVar12 == 0) goto LAB_0024d8ff;
  goto LAB_0024d8c5;
LAB_0024d9e0:
  local_68 = puVar7;
  iVar11 = 9;
  uVar9 = 0;
  uVar16 = 0;
  goto LAB_0024dabd;
  while( true ) {
    local_68 = local_68 + 2;
    lVar14 = lVar14 + -1;
    puVar6 = local_68;
    local_58 = uVar8;
    if (lVar14 == 0) break;
LAB_0024dcef:
    if ((ushort)(*local_68 << 8 | *local_68 >> 8) == glyph_index) {
      puVar7 = local_68 + 3;
      uVar16 = (ulong)(ushort)(local_68[1] << 8 | local_68[1] >> 8);
      local_68 = local_68 + 3;
      uVar9 = (ulong)(ushort)(*puVar7 << 8 | *puVar7 >> 8);
      iVar11 = 0;
      puVar6 = local_68;
      local_58 = uVar8;
      break;
    }
  }
LAB_0024da0f:
  FVar5 = (FT_Error)puVar6;
joined_r0x0024da11:
  if (iVar11 != 0) {
    if (iVar11 != 9) {
      return FVar5;
    }
    goto LAB_0024d8ff;
  }
  goto LAB_0024dc8b;
  while( true ) {
    uVar10 = *puVar6;
    puVar6 = puVar6 + 1;
    uVar16 = uVar16 + 1;
    if ((ushort)(uVar10 << 8 | uVar10 >> 8) == glyph_index) break;
LAB_0024dd48:
    puVar7 = puVar6;
    if ((lVar14 + lVar13 + uVar9 + (ulong)*(byte *)((long)local_68 + 3)) - 1 == uVar16)
    goto LAB_0024d9e0;
  }
  bVar17 = uVar16 < uVar8;
LAB_0024dd69:
  uVar9 = 0;
  iVar11 = 9;
  local_68 = puVar6;
  if (bVar17) {
    uVar9 = (ulong)(uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                   uVar15 << 0x18);
    uVar16 = uVar16 * uVar9;
    uVar9 = uVar9 + uVar16;
    iVar11 = 0;
  }
  else {
    uVar16 = 0;
  }
LAB_0024dabd:
  if (iVar11 != 9) {
    if (iVar11 != 0) {
      return (FT_Error)puVar6;
    }
LAB_0024dc8b:
    if (uVar16 <= uVar9) {
      FVar5 = tt_sbit_decoder_load_bitmap
                        (decoder,(uint)(ushort)(uVar2 << 8 | uVar2 >> 8),
                         uVar16 + (uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                                  uVar4 << 0x18),uVar9 - uVar16,x_pos,y_pos,recurse_count,
                         metrics_only);
      return FVar5;
    }
  }
LAB_0024d8ff:
  FVar5 = 0x15;
  if (recurse_count == 0) {
    FVar5 = 0x9d;
  }
  return FVar5;
}

Assistant:

static FT_Error
  tt_sbit_decoder_load_image( TT_SBitDecoder  decoder,
                              FT_UInt         glyph_index,
                              FT_Int          x_pos,
                              FT_Int          y_pos,
                              FT_UInt         recurse_count,
                              FT_Bool         metrics_only )
  {
    FT_Byte*  p          = decoder->eblc_base + decoder->strike_index_array;
    FT_Byte*  p_limit    = decoder->eblc_limit;
    FT_ULong  num_ranges = decoder->strike_index_count;
    FT_UInt   start, end, index_format, image_format;
    FT_ULong  image_start = 0, image_end = 0, image_offset;


    /* arbitrary recursion limit */
    if ( recurse_count > 100 )
    {
      FT_TRACE4(( "tt_sbit_decoder_load_image:"
                  " recursion depth exceeded\n" ));
      goto Failure;
    }


    /* First, we find the correct strike range that applies to this */
    /* glyph index.                                                 */
    for ( ; num_ranges > 0; num_ranges-- )
    {
      start = FT_NEXT_USHORT( p );
      end   = FT_NEXT_USHORT( p );

      if ( glyph_index >= start && glyph_index <= end )
        goto FoundRange;

      p += 4;  /* ignore index offset */
    }
    goto NoBitmap;

  FoundRange:
    image_offset = FT_NEXT_ULONG( p );

    /* overflow check */
    p = decoder->eblc_base + decoder->strike_index_array;
    if ( image_offset > (FT_ULong)( p_limit - p ) )
      goto Failure;

    p += image_offset;
    if ( p + 8 > p_limit )
      goto NoBitmap;

    /* now find the glyph's location and extend within the ebdt table */
    index_format = FT_NEXT_USHORT( p );
    image_format = FT_NEXT_USHORT( p );
    image_offset = FT_NEXT_ULONG ( p );

    switch ( index_format )
    {
    case 1: /* 4-byte offsets relative to `image_offset' */
      p += 4 * ( glyph_index - start );
      if ( p + 8 > p_limit )
        goto NoBitmap;

      image_start = FT_NEXT_ULONG( p );
      image_end   = FT_NEXT_ULONG( p );

      if ( image_start == image_end )  /* missing glyph */
        goto NoBitmap;
      break;

    case 2: /* big metrics, constant image size */
      {
        FT_ULong  image_size;


        if ( p + 12 > p_limit )
          goto NoBitmap;

        image_size = FT_NEXT_ULONG( p );

        if ( tt_sbit_decoder_load_metrics( decoder, &p, p_limit, 1 ) )
          goto NoBitmap;

        image_start = image_size * ( glyph_index - start );
        image_end   = image_start + image_size;
      }
      break;

    case 3: /* 2-byte offsets relative to 'image_offset' */
      p += 2 * ( glyph_index - start );
      if ( p + 4 > p_limit )
        goto NoBitmap;

      image_start = FT_NEXT_USHORT( p );
      image_end   = FT_NEXT_USHORT( p );

      if ( image_start == image_end )  /* missing glyph */
        goto NoBitmap;
      break;

    case 4: /* sparse glyph array with (glyph,offset) pairs */
      {
        FT_ULong  mm, num_glyphs;


        if ( p + 4 > p_limit )
          goto NoBitmap;

        num_glyphs = FT_NEXT_ULONG( p );

        /* overflow check for p + ( num_glyphs + 1 ) * 4 */
        if ( p + 4 > p_limit                                         ||
             num_glyphs > (FT_ULong)( ( ( p_limit - p ) >> 2 ) - 1 ) )
          goto NoBitmap;

        for ( mm = 0; mm < num_glyphs; mm++ )
        {
          FT_UInt  gindex = FT_NEXT_USHORT( p );


          if ( gindex == glyph_index )
          {
            image_start = FT_NEXT_USHORT( p );
            p          += 2;
            image_end   = FT_PEEK_USHORT( p );
            break;
          }
          p += 2;
        }

        if ( mm >= num_glyphs )
          goto NoBitmap;
      }
      break;

    case 5: /* constant metrics with sparse glyph codes */
    case 19:
      {
        FT_ULong  image_size, mm, num_glyphs;


        if ( p + 16 > p_limit )
          goto NoBitmap;

        image_size = FT_NEXT_ULONG( p );

        if ( tt_sbit_decoder_load_metrics( decoder, &p, p_limit, 1 ) )
          goto NoBitmap;

        num_glyphs = FT_NEXT_ULONG( p );

        /* overflow check for p + 2 * num_glyphs */
        if ( num_glyphs > (FT_ULong)( ( p_limit - p ) >> 1 ) )
          goto NoBitmap;

        for ( mm = 0; mm < num_glyphs; mm++ )
        {
          FT_UInt  gindex = FT_NEXT_USHORT( p );


          if ( gindex == glyph_index )
            break;
        }

        if ( mm >= num_glyphs )
          goto NoBitmap;

        image_start = image_size * mm;
        image_end   = image_start + image_size;
      }
      break;

    default:
      goto NoBitmap;
    }

    if ( image_start > image_end )
      goto NoBitmap;

    image_end  -= image_start;
    image_start = image_offset + image_start;

    FT_TRACE3(( "tt_sbit_decoder_load_image:"
                " found sbit (format %d) for glyph index %d\n",
                image_format, glyph_index ));

    return tt_sbit_decoder_load_bitmap( decoder,
                                        image_format,
                                        image_start,
                                        image_end,
                                        x_pos,
                                        y_pos,
                                        recurse_count,
                                        metrics_only );

  Failure:
    return FT_THROW( Invalid_Table );

  NoBitmap:
    if ( recurse_count )
    {
      FT_TRACE4(( "tt_sbit_decoder_load_image:"
                  " missing subglyph sbit with glyph index %d\n",
                  glyph_index ));
      return FT_THROW( Invalid_Composite );
    }

    FT_TRACE4(( "tt_sbit_decoder_load_image:"
                " no sbit found for glyph index %d\n", glyph_index ));
    return FT_THROW( Missing_Bitmap );
  }